

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

char * nifti_findimgname(char *fname,int nifti_type)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  char *__dest;
  char *pcVar3;
  long lVar4;
  char extzip [4];
  char extnia [5];
  char elist [2] [5];
  char local_3c [12];
  char local_30 [16];
  
  builtin_strncpy(local_30,".nii",5);
  builtin_strncpy(local_30 + 5,".img",5);
  builtin_strncpy(local_3c,".gz",4);
  builtin_strncpy(local_3c + 4,".nia",5);
  iVar1 = nifti_validfilename(fname);
  if (iVar1 == 0) {
    return (char *)0x0;
  }
  __s = nifti_makebasename(fname);
  sVar2 = strlen(__s);
  __dest = (char *)calloc(1,sVar2 + 8);
  if (__dest == (char *)0x0) {
    nifti_findimgname_cold_1();
  }
  else {
    pcVar3 = nifti_find_file_extension(fname);
    if ((pcVar3 != (char *)0x0) && (iVar1 = is_uppercase(pcVar3), iVar1 != 0)) {
      make_uppercase(local_30);
      make_uppercase(local_30 + 5);
      make_uppercase(local_3c);
      make_uppercase(local_3c + 4);
    }
    if (nifti_type == 1) {
      lVar4 = 0;
LAB_0010ac35:
      strcpy(__dest,__s);
      strcat(__dest,local_30 + lVar4 * 5);
      iVar1 = nifti_fileexists(__dest);
      if (iVar1 != 0) goto LAB_0010acbd;
      strcat(__dest,local_3c);
      iVar1 = nifti_fileexists(__dest);
      if (iVar1 != 0) goto LAB_0010acbd;
      strcpy(__dest,__s);
      strcat(__dest,local_30 + (ulong)((uint)lVar4 ^ 1) * 5);
      iVar1 = nifti_fileexists(__dest);
      if (iVar1 != 0) goto LAB_0010acbd;
      pcVar3 = local_3c;
    }
    else {
      if (nifti_type != 3) {
        lVar4 = 1;
        goto LAB_0010ac35;
      }
      strcpy(__dest,__s);
      pcVar3 = local_3c + 4;
    }
    strcat(__dest,pcVar3);
    iVar1 = nifti_fileexists(__dest);
    if (iVar1 != 0) goto LAB_0010acbd;
    free(__s);
    __s = __dest;
  }
  __dest = (char *)0x0;
LAB_0010acbd:
  free(__s);
  return __dest;
}

Assistant:

char * nifti_findimgname(const char* fname , int nifti_type)
{
   /* store all extensions as strings, in case we need to go uppercase */
   char *basename, *imgname, elist[2][5] = { ".nii", ".img" };
   char  extzip[4] = ".gz";
   char  extnia[5] = ".nia";
   const char *ext;
   int   first;  /* first extension to use */

   /* check input file(s) for sanity */
   if( !nifti_validfilename(fname) ) return NULL;

   basename =  nifti_makebasename(fname);
   imgname = (char *)calloc(sizeof(char),strlen(basename)+8);
   if( !imgname ){
      fprintf(stderr,"** nifti_findimgname: failed to alloc imgname\n");
      free(basename);
      return NULL;
   }

   /* if we are looking for uppercase, apply the fact now */
   ext = nifti_find_file_extension(fname);
   if( ext && is_uppercase(ext) ) {
      make_uppercase(elist[0]);
      make_uppercase(elist[1]);
      make_uppercase(extzip);
      make_uppercase(extnia);
   }

   /* only valid extension for ASCII type is .nia, handle first */
   if( nifti_type == NIFTI_FTYPE_ASCII ){
      strcpy(imgname,basename);
      strcat(imgname,extnia);
      if (nifti_fileexists(imgname)) { free(basename); return imgname; }

   } else {

      /**- test for .nii and .img (don't assume input type from image type) */
      /**- if nifti_type = 1, check for .nii first, else .img first         */

      /* if we get 3 or more extensions, can make a loop here... */

      if (nifti_type == NIFTI_FTYPE_NIFTI1_1) first = 0; /* should match .nii */
      else                                    first = 1; /* should match .img */

      strcpy(imgname,basename);
      strcat(imgname,elist[first]);
      if (nifti_fileexists(imgname)) { free(basename); return imgname; }
#ifdef HAVE_ZLIB  /* then also check for .gz */
      strcat(imgname,extzip);
      if (nifti_fileexists(imgname)) { free(basename); return imgname; }
#endif

      /* failed to find image file with expected extension, try the other */

      strcpy(imgname,basename);
      strcat(imgname,elist[1-first]);  /* can do this with only 2 choices */
      if (nifti_fileexists(imgname)) { free(basename); return imgname; }
#ifdef HAVE_ZLIB  /* then also check for .gz */
      strcat(imgname,extzip);
      if (nifti_fileexists(imgname)) { free(basename); return imgname; }
#endif
   }

   /**- if nothing has been found, return NULL */
   free(basename);
   free(imgname);
   return NULL;
}